

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_BrScanExportDirAbsent_Test::TestBody
          (InterpreterTestSuite_PC_BrScanExportDirAbsent_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Value *pVVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_3a0;
  AssertHelper local_380;
  Message local_378;
  bool local_369;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__1;
  Error local_338;
  Value local_310;
  string local_2c8;
  AssertHelper local_2a8;
  Message local_2a0;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_;
  allocator local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  Expression local_1f0;
  allocator local_1d1;
  undefined1 local_1d0 [8];
  string jsonFileName;
  Value value;
  Expression expr;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_BrScanExportDirAbsent_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value((Value *)((long)&jsonFileName.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1d0,"./tmp/br-list.json",&local_1d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"br scan --timeout 1 --export ",&local_231);
  std::operator+(&local_210,&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  ot::commissioner::Interpreter::ParseExpression(&local_1f0,(Interpreter *)local_140,&local_210);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,&local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,this_00)
  ;
  pVVar1 = (Value *)((long)&jsonFileName.field_2 + 8);
  ot::commissioner::Interpreter::Value::operator=(pVVar1,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  local_291 = ot::commissioner::Interpreter::Value::HasNoError(pVVar1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)local_290,(AssertionResult *)0x46a487,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x8c1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  ot::commissioner::Interpreter::PrintOrExport
            ((Interpreter *)local_140,(Value *)((long)&jsonFileName.field_2 + 8));
  std::__cxx11::string::string((string *)&gtest_ar__1.message_,(string *)local_1d0);
  ot::commissioner::PathExists(&local_338,(string *)&gtest_ar__1.message_);
  ot::commissioner::Interpreter::Value::Value(&local_310,&local_338);
  pVVar1 = (Value *)((long)&jsonFileName.field_2 + 8);
  ot::commissioner::Interpreter::Value::operator=(pVVar1,&local_310);
  ot::commissioner::Interpreter::Value::~Value(&local_310);
  ot::commissioner::Error::~Error(&local_338);
  std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
  local_369 = ot::commissioner::Interpreter::Value::HasNoError(pVVar1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_368,&local_369,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar2) {
    testing::Message::Message(&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a0,(internal *)local_368,(AssertionResult *)0x46a487,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x8c4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  std::__cxx11::string::~string((string *)local_1d0);
  ot::commissioner::Interpreter::Value::~Value((Value *)((long)&jsonFileName.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrScanExportDirAbsent)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    std::string jsonFileName = "./tmp/br-list.json";
    expr  = ctx.mInterpreter.ParseExpression(std::string("br scan --timeout 1 --export ") + jsonFileName);
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    ctx.mInterpreter.PrintOrExport(value);
    value = PathExists(jsonFileName);
    EXPECT_TRUE(value.HasNoError());
}